

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

int lws_client_http_multipart
              (lws *wsi,char *name,char *filename,char *content_type,char **p,char *end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *end_local;
  char **p_local;
  char *content_type_local;
  char *filename_local;
  char *name_local;
  lws *wsi_local;
  
  if (((byte)(wsi->http).field_0x88 >> 3 & 1) != 0) {
    iVar2 = (int)end;
    iVar1 = (int)p;
    if (name == (char *)0x0) {
      iVar2 = lws_snprintf(*p,(long)(iVar2 - iVar1),"\r\n--%s--\r\n",(wsi->http).multipart_boundary)
      ;
      *p = *p + iVar2;
      wsi_local._4_4_ = 0;
    }
    else {
      if ((*(ulong *)&wsi->field_0x2dc >> 0x39 & 1) != 0) {
        iVar3 = lws_snprintf(*p,(long)(iVar2 - iVar1),"\r\n");
        *p = *p + iVar3;
      }
      *(ulong *)&wsi->field_0x2dc =
           *(ulong *)&wsi->field_0x2dc & 0xfdffffffffffffff | 0x200000000000000;
      iVar3 = lws_snprintf(*p,(long)(iVar2 - iVar1),
                           "--%s\r\nContent-Disposition: form-data; name=\"%s\"",
                           (wsi->http).multipart_boundary,name);
      *p = *p + iVar3;
      if (filename != (char *)0x0) {
        iVar3 = lws_snprintf(*p,(long)(iVar2 - iVar1),"; filename=\"%s\"",filename);
        *p = *p + iVar3;
      }
      if (content_type != (char *)0x0) {
        iVar3 = lws_snprintf(*p,(long)(iVar2 - iVar1),"\r\nContent-Type: %s",content_type);
        *p = *p + iVar3;
      }
      iVar2 = lws_snprintf(*p,(long)(iVar2 - iVar1),"\r\n\r\n");
      *p = *p + iVar2;
      wsi_local._4_4_ = (uint)(*p == end);
    }
    return wsi_local._4_4_;
  }
  __assert_fail("wsi->http.multipart",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-http.c"
                ,0x3a7,
                "int lws_client_http_multipart(struct lws *, const char *, const char *, const char *, char **, char *)"
               );
}

Assistant:

int
lws_client_http_multipart(struct lws *wsi, const char *name,
			  const char *filename, const char *content_type,
			  char **p, char *end)
{
	/*
	 * Client conn must have been created with LCCSCF_HTTP_MULTIPART_MIME
	 * flag to use this api
	 */
	assert(wsi->http.multipart);

	if (!name) {
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p),
					"\xd\xa--%s--\xd\xa",
					wsi->http.multipart_boundary);

		return 0;
	}

	if (wsi->client_subsequent_mime_part)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa");
	wsi->client_subsequent_mime_part = 1;

	*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "--%s\xd\xa"
				    "Content-Disposition: form-data; "
				      "name=\"%s\"",
				      wsi->http.multipart_boundary, name);
	if (filename)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p),
				   "; filename=\"%s\"", filename);

	if (content_type)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa"
				"Content-Type: %s", content_type);

	*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa\xd\xa");

	return *p == end;
}